

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

int use_stethoscope(obj *obj)

{
  char cVar1;
  rm (*parVar2) [21];
  level *plVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  obj *poVar9;
  ulong uVar10;
  uint y;
  uint uVar11;
  monst *mtmp;
  char *line;
  xchar x;
  bool bVar12;
  bool bVar13;
  schar dy;
  schar dx;
  schar dz;
  int res;
  char local_4b;
  char local_4a;
  char local_49;
  uint local_48;
  uint local_44;
  ulong local_40;
  monst *local_38;
  
  if (((u._1052_1_ & 1) == 0) ||
     ((u.ustuck)->data != mons + 0x9f && (u.ustuck)->data->mlet != '\x16')) {
    bVar12 = false;
  }
  else {
    uVar10 = 3;
    if (urole.malenum == 0x15e) {
      uVar10 = 10;
    }
    uVar5 = mt_random();
    bVar12 = (int)((ulong)uVar5 % uVar10) == 0;
  }
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pline("You have no hands!");
    return 0;
  }
  iVar6 = freehand();
  if (iVar6 == 0) {
    pcVar8 = body_part(6);
    pline("You have no free %s.",pcVar8);
    return 0;
  }
  iVar6 = getdir((char *)0x0,&local_4a,&local_4b,&local_49);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = (int)youmonst.movement;
  bVar13 = stetho_last_used_movement == iVar6 && stetho_last_used_move == moves;
  uVar11 = (uint)bVar13;
  uVar5 = (uint)bVar13;
  stetho_last_used_move = moves;
  stetho_last_used_movement = iVar6;
  local_44 = uVar5;
  if ('\0' < local_49 && u.usteed != (monst *)0x0) {
    mtmp = u.usteed;
    if (!bVar12) goto LAB_00146329;
LAB_00146244:
    pcVar8 = Monnam(u.ustuck);
    pline("%s interferes.",pcVar8);
    mtmp = u.ustuck;
LAB_00146329:
    mstatusline(mtmp);
    return uVar5;
  }
  if ((u._1052_1_ & 1) == 0) {
    if (local_49 != '\0') {
      if ((u._1052_1_ & 2) != 0) {
        pcVar8 = "faint splashing.";
LAB_0014648d:
        You_hear(pcVar8);
        return local_44;
      }
      if (local_49 < '\0') {
LAB_001465bd:
        pcVar8 = ceiling((int)u.ux,(int)u.uy);
      }
      else {
        bVar4 = can_reach_floor();
        if (bVar4 != '\0') {
          bVar4 = its_dead((int)u.ux,(int)u.uy,(int *)&local_44,obj);
          if (bVar4 != '\0') {
            return local_44;
          }
          bVar4 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
          if (bVar4 != '\0') {
            pcVar8 = "the crackling of hellfire.";
            goto LAB_0014648d;
          }
          pcVar8 = surface((int)u.ux,(int)u.uy);
          line = "The %s seems healthy enough.";
          goto LAB_001465d3;
        }
        if (local_49 < '\x01') goto LAB_001465bd;
        pcVar8 = surface((int)u.ux,(int)u.uy);
      }
      line = "You can\'t reach the %s.";
LAB_001465d3:
      pline(line,pcVar8);
      return local_44;
    }
  }
  else {
    mtmp = u.ustuck;
    if ((local_4b != '\0' || local_4a != '\0') || local_49 != '\0') goto LAB_00146329;
    if (bVar12) goto LAB_00146244;
  }
  if (((obj->field_0x4a & 1) != 0) && (uVar7 = mt_random(), (uVar7 & 1) == 0)) {
    pcVar8 = "your heart beat.";
LAB_001464ac:
    You_hear(pcVar8);
    return uVar11;
  }
  if ((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c')
      ) || ((u.uprops[0x1c].intrinsic != 0 &&
            (uVar11 = mt_random(), uVar11 * -0x33333333 < 0x33333334)))) {
    confdir(&local_4a,&local_4b);
  }
  if (local_4a == '\0' && local_4b == '\0') {
    ustatusline();
    return uVar5;
  }
  uVar11 = (int)u.uy + (int)local_4b;
  if (0x4e < ((int)u.ux + (int)local_4a) - 1U || 0x14 < uVar11) {
    pcVar8 = "a faint typing noise.";
    uVar11 = 0;
    goto LAB_001464ac;
  }
  uVar7 = (int)u.ux + (int)local_4a;
  local_40 = (ulong)uVar7;
  local_38 = level->monsters[uVar7][uVar11];
  local_48 = uVar11;
  if ((local_38 != (monst *)0x0) && ((local_38->field_0x61 & 2) == 0)) {
    mstatusline(local_38);
    if (((char)*(uint *)&local_38->field_0x60 < '\0') &&
       (*(uint *)&local_38->field_0x60 = *(uint *)&local_38->field_0x60 & 0xffffff7f,
       (viz_array[uVar11][uVar7] & 2U) != 0)) {
      newsym((int)local_38->mx,(int)local_38->my);
    }
    if (local_38->wormno == '\0') {
      if ((viz_array[local_38->my][local_38->mx] & 2U) != 0) goto LAB_0014677a;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001466d7;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001466ce;
      }
      else {
LAB_001466ce:
        if (ublindf == (obj *)0x0) goto LAB_001467c2;
LAB_001466d7:
        if (ublindf->oartifact != '\x1d') goto LAB_001467c2;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) &&
          ((viz_array[local_38->my][local_38->mx] & 1U) != 0)) &&
         ((local_38->data->mflags3 & 0x200) != 0)) goto LAB_0014677a;
    }
    else {
      bVar4 = worm_known(level,local_38);
      if (bVar4 != '\0') {
LAB_0014677a:
        uVar11 = *(uint *)&local_38->field_0x60;
        if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar11 & 0x280) == 0) goto LAB_001467b4;
        }
        else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001467b4:
          if ((u._1052_1_ & 0x20) == 0) {
            return uVar5;
          }
        }
      }
    }
LAB_001467c2:
    if (((local_38->data->mflags1 & 0x10000) != 0) ||
       ((poVar9 = which_armor(local_38,4), poVar9 != (obj *)0x0 &&
        (poVar9 = which_armor(local_38,4), poVar9->otyp == 0x4f)))) goto joined_r0x001468f0;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014681d;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00146818;
    }
    else {
LAB_00146818:
      if (ublindf != (obj *)0x0) {
LAB_0014681d:
        if (ublindf->oartifact == '\x1d') goto LAB_0014689e;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
        return uVar5;
      }
    }
LAB_0014689e:
    if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
       (iVar6 = dist2((int)local_38->mx,(int)local_38->my,(int)u.ux,(int)u.uy), iVar6 < 0x41)) {
      return uVar5;
    }
joined_r0x001468f0:
    if (u.uprops[0x42].intrinsic != 0) {
      return uVar5;
    }
    if (u.uprops[0x42].extrinsic != 0) {
      return uVar5;
    }
    bVar4 = match_warn_of_mon(local_38);
    if (bVar4 != '\0') {
      return uVar5;
    }
    map_invisible((xchar)local_40,(xchar)local_48);
    return uVar5;
  }
  if ((level->locations[uVar7][uVar11].field_0x6 & 8) != 0) {
    unmap_object(uVar7,uVar11);
    newsym((int)local_40,local_48);
    pline("The invisible monster must have moved.");
  }
  y = local_48;
  plVar3 = level;
  parVar2 = level->locations;
  cVar1 = level->locations[uVar7][uVar11].typ;
  if (cVar1 != '\x10') {
    if (cVar1 != '\x0f') {
      bVar4 = its_dead((int)local_40,local_48,(int *)&local_44,obj);
      if (bVar4 != '\0') {
        return local_44;
      }
      pline("You hear nothing special.");
      return local_44;
    }
    You_hear("a hollow sound.  This must be a secret %s!","door");
    cvt_sdoor_to_door(parVar2[uVar7] + uVar11,&u.uz);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00146591;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014658c;
LAB_00146701:
      iVar6 = (int)local_40;
      goto LAB_0014672a;
    }
LAB_0014658c:
    if (ublindf != (obj *)0x0) {
LAB_00146591:
      if (ublindf->oartifact == '\x1d') goto LAB_00146701;
    }
    x = (xchar)local_40;
    goto LAB_0014663f;
  }
  You_hear("a hollow sound.  This must be a secret %s!","passage");
  uVar10 = local_40;
  y = local_48;
  plVar3->locations[uVar7][uVar11].typ = '\x18';
  iVar6 = (int)local_40;
  unblock_point(iVar6,local_48);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014672a;
      goto LAB_0014662c;
    }
LAB_00146631:
    if (ublindf->oartifact == '\x1d') {
LAB_0014672a:
      newsym(iVar6,y);
      return uVar5;
    }
  }
  else {
LAB_0014662c:
    if (ublindf != (obj *)0x0) goto LAB_00146631;
  }
  x = (xchar)uVar10;
LAB_0014663f:
  feel_location(x,(xchar)y);
  return uVar5;
}

Assistant:

static int use_stethoscope(struct obj *obj)
{
	struct monst *mtmp;
	struct rm *loc;
	int rx, ry, res;
	schar dx, dy, dz;
	boolean interference = (u.uswallow && is_whirly(u.ustuck->data) &&
				!rn2(Role_if (PM_HEALER) ? 10 : 3));

	if (nohands(youmonst.data)) {	/* should also check for no ears and/or deaf */
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}
	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;

	res = (moves == stetho_last_used_move) &&
	      (youmonst.movement == stetho_last_used_movement);
	stetho_last_used_move = moves;
	stetho_last_used_movement = youmonst.movement;

	if (u.usteed && dz > 0) {
		if (interference) {
			pline("%s interferes.", Monnam(u.ustuck));
			mstatusline(u.ustuck);
		} else
			mstatusline(u.usteed);
		return res;
	} else if (u.uswallow && (dx || dy || dz)) {
		mstatusline(u.ustuck);
		return res;
	} else if (u.uswallow && interference) {
		pline("%s interferes.", Monnam(u.ustuck));
		mstatusline(u.ustuck);
		return res;
	} else if (dz) {
		if (Underwater)
		    You_hear("faint splashing.");
		else if (dz < 0 || !can_reach_floor())
		    pline("You can't reach the %s.",
			(dz > 0) ? surface(u.ux, u.uy) : ceiling(u.ux, u.uy));
		else if (its_dead(u.ux, u.uy, &res, obj))
		    ;	/* message already given */
		else if (Is_stronghold(&u.uz))
		    You_hear("the crackling of hellfire.");
		else
		    pline("The %s seems healthy enough.", surface(u.ux, u.uy));
		return res;
	} else if (obj->cursed && !rn2(2)) {
		You_hear("your heart beat.");
		return res;
	}
	if (Stunned || (Confusion && !rn2(5)))
	    confdir(&dx, &dy);
	if (!dx && !dy) {
		ustatusline();
		return res;
	}
	
	rx = u.ux + dx;
	ry = u.uy + dy;
	if (!isok(rx, ry)) {
		You_hear("a faint typing noise.");
		return 0;
	}
	if ((mtmp = m_at(level, rx, ry)) != 0) {
		mstatusline(mtmp);
		if (mtmp->mundetected) {
			mtmp->mundetected = 0;
			if (cansee(rx, ry)) newsym(mtmp->mx, mtmp->my);
		}
		if (!canspotmon(level, mtmp))
			map_invisible(rx, ry);
		return res;
	}
	if (level->locations[rx][ry].mem_invis) {
		unmap_object(rx, ry);
		newsym(rx, ry);
		pline("The invisible monster must have moved.");
	}
	loc = &level->locations[rx][ry];
	switch(loc->typ) {
	case SDOOR:
		You_hear(hollow_str, "door");
		cvt_sdoor_to_door(loc, &u.uz);		/* ->typ = DOOR */
		if (Blind) feel_location(rx,ry);
		else newsym(rx,ry);
		return res;
	case SCORR:
		You_hear(hollow_str, "passage");
		loc->typ = CORR;
		unblock_point(rx,ry);
		if (Blind) feel_location(rx,ry);
		else newsym(rx,ry);
		return res;
	}

	if (!its_dead(rx, ry, &res, obj))
	    pline("You hear nothing special.");	/* not You_hear()  */
	return res;
}